

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjunctiveMonotone.c
# Opt level: O2

Aig_Man_t *
createDisjunctiveMonotoneTester
          (Aig_Man_t *pAig,aigPoIndices *aigPoIndicesArg,
          antecedentConsequentVectorsStruct *anteConseVectors,int *startMonotonePropPo)

{
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Aig_Man_t *p_01;
  size_t sVar1;
  char *__s;
  void *pvVar2;
  Aig_Obj_t *pAVar3;
  Vec_Ptr_t *p_02;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Vec_Ptr_t *p_03;
  Vec_Ptr_t *p_04;
  Aig_Obj_t *pAVar7;
  ulong uVar8;
  Aig_Obj_t *pAVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  p = anteConseVectors->attrConsequentCandidates;
  iVar11 = 0;
  if (p == (Vec_Int_t *)0x0) {
    p_01 = (Aig_Man_t *)0x0;
  }
  else {
    iVar10 = aigPoIndicesArg->attrPendingSignalIndex;
    p_00 = anteConseVectors->attrAntecedents;
    p_01 = Aig_ManStart(pAig->vObjs->nSize);
    sVar1 = strlen(pAig->pName);
    __s = (char *)malloc(sVar1 + 0xb);
    p_01->pName = __s;
    sprintf(__s,"%s_%s",pAig->pName,"monotone");
    p_01->pSpec = (char *)0x0;
    pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_01->pConst1;
    for (; iVar11 < pAig->nTruePis; iVar11 = iVar11 + 1) {
      pvVar2 = Vec_PtrEntry(pAig->vCis,iVar11);
      pAVar3 = Aig_ObjCreateCi(p_01);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
    }
    for (iVar11 = 0; iVar11 < pAig->nRegs; iVar11 = iVar11 + 1) {
      pvVar2 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar11);
      pAVar3 = Aig_ObjCreateCi(p_01);
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar3;
    }
    pAVar3 = Aig_ObjCreateCi(p_01);
    p_02 = Vec_PtrAlloc(p->nSize);
    for (iVar12 = 0; iVar12 < p->nSize; iVar12 = iVar12 + 1) {
      Vec_IntEntry(p,iVar12);
      pAVar4 = Aig_ObjCreateCi(p_01);
      Vec_PtrPush(p_02,pAVar4);
      iVar11 = iVar11 + 1;
    }
    iVar12 = iVar11 + 1;
    for (iVar13 = 0; iVar13 < pAig->vObjs->nSize; iVar13 = iVar13 + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar13);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7)) {
        pAVar5 = Aig_ObjChild0Copy(pAVar4);
        if (((ulong)pAVar4 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
        }
        uVar8 = (ulong)pAVar4->pFanin1 & 0xfffffffffffffffe;
        if (uVar8 == 0) {
          pAVar9 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar9 = (Aig_Obj_t *)((ulong)((uint)pAVar4->pFanin1 & 1) ^ *(ulong *)(uVar8 + 0x28));
        }
        pAVar5 = Aig_And(p_01,pAVar5,pAVar9);
        (pAVar4->field_5).pData = pAVar5;
      }
    }
    if (aigPoIndicesArg->attrSafetyInvarIndex == -1) {
      pAVar4 = p_01->pConst1;
    }
    else {
      pAVar4 = Aig_ManCo(pAig,aigPoIndicesArg->attrSafetyInvarIndex);
      pAVar4 = pAVar4->pFanin0;
      if (((ulong)pAVar4 & 1) == 0) {
        pAVar4 = (Aig_Obj_t *)(pAVar4->field_5).pData;
      }
      else {
        pAVar4 = (Aig_Obj_t *)(*(ulong *)(((ulong)pAVar4 & 0xfffffffffffffffe) + 0x28) ^ 1);
      }
    }
    pAVar5 = Aig_ManCo(pAig,iVar10);
    pAVar5 = pAVar5->pFanin0;
    if (((ulong)pAVar5 & 1) == 0) {
      pAVar5 = (Aig_Obj_t *)(pAVar5->field_5).pData;
    }
    else {
      pAVar5 = (Aig_Obj_t *)(*(ulong *)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x28) ^ 1);
    }
    pAVar3 = Aig_And(p_01,pAVar5,pAVar3);
    pAVar9 = (Aig_Obj_t *)((ulong)p_01->pConst1 ^ 1);
    if (p_00 != (Vec_Int_t *)0x0) {
      for (iVar10 = 0; iVar10 < p_00->nSize; iVar10 = iVar10 + 1) {
        iVar13 = Vec_IntEntry(p_00,iVar10);
        pAVar6 = Aig_ManCo(pAig,iVar13);
        pAVar6 = pAVar6->pFanin0;
        if (((ulong)pAVar6 & 1) == 0) {
          pAVar6 = (Aig_Obj_t *)(pAVar6->field_5).pData;
        }
        else {
          pAVar6 = (Aig_Obj_t *)(*(ulong *)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x28) ^ 1);
        }
        pAVar9 = Aig_Or(p_01,pAVar6,pAVar9);
      }
    }
    p_03 = Vec_PtrAlloc(p->nSize);
    p_04 = Vec_PtrAlloc(p->nSize);
    for (iVar10 = 0; iVar10 < p->nSize; iVar10 = iVar10 + 1) {
      iVar13 = Vec_IntEntry(p,iVar10);
      pAVar6 = Aig_ManCo(pAig,iVar13);
      pAVar6 = pAVar6->pFanin0;
      if (((ulong)pAVar6 & 1) == 0) {
        pAVar6 = (Aig_Obj_t *)(pAVar6->field_5).pData;
      }
      else {
        pAVar6 = (Aig_Obj_t *)(*(ulong *)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x28) ^ 1);
      }
      pAVar6 = Aig_Or(p_01,pAVar6,pAVar9);
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p_02,iVar10);
      pAVar7 = Aig_And(p_01,pAVar3,pAVar7);
      pAVar7 = Aig_Or(p_01,(Aig_Obj_t *)((ulong)pAVar7 ^ 1),pAVar6);
      pAVar7 = Aig_And(p_01,pAVar7,pAVar4);
      Vec_PtrPush(p_04,pAVar6);
      Vec_PtrPush(p_03,pAVar7);
    }
    for (iVar10 = 0; iVar10 < pAig->nTruePos; iVar10 = iVar10 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,iVar10);
      pAVar4 = Aig_ObjChild0Copy(pAVar3);
      pAVar4 = Aig_ObjCreateCo(p_01,pAVar4);
      (pAVar3->field_5).pData = pAVar4;
    }
    *startMonotonePropPo = iVar10;
    iVar10 = p_03->nSize;
    iVar13 = 0;
    if (iVar10 < 1) {
      iVar10 = 0;
    }
    for (; iVar10 != iVar13; iVar13 = iVar13 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_03,iVar13);
      Aig_ObjCreateCo(p_01,pAVar3);
    }
    for (iVar10 = 0; iVar10 < pAig->nRegs; iVar10 = iVar10 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar10);
      pAVar3 = Aig_ObjChild0Copy(pAVar3);
      Aig_ObjCreateCo(p_01,pAVar3);
      iVar11 = iVar11 + -1;
    }
    Aig_ObjCreateCo(p_01,pAVar5);
    iVar10 = p_04->nSize;
    iVar13 = 0;
    if (iVar10 < 1) {
      iVar10 = 0;
    }
    for (; iVar10 != iVar13; iVar13 = iVar13 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_04,iVar13);
      Aig_ObjCreateCo(p_01,pAVar3);
    }
    Aig_ManSetRegNum(p_01,iVar12);
    Aig_ManCleanup(p_01);
    iVar12 = Aig_ManCheck(p_01);
    if (iVar12 == 0) {
      __assert_fail("Aig_ManCheck( pNewAig )",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/disjunctiveMonotone.c"
                    ,0x10a,
                    "Aig_Man_t *createDisjunctiveMonotoneTester(Aig_Man_t *, struct aigPoIndices *, struct antecedentConsequentVectorsStruct *, int *)"
                   );
    }
    if (iVar10 != iVar11) {
      __assert_fail("loCopied + loCreated == liCopied + liCreated",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/live/disjunctiveMonotone.c"
                    ,0x10b,
                    "Aig_Man_t *createDisjunctiveMonotoneTester(Aig_Man_t *, struct aigPoIndices *, struct antecedentConsequentVectorsStruct *, int *)"
                   );
    }
    Vec_PtrFree(p_02);
    Vec_PtrFree(p_03);
    Vec_PtrFree(p_04);
  }
  return p_01;
}

Assistant:

Aig_Man_t *createDisjunctiveMonotoneTester(Aig_Man_t *pAig, struct aigPoIndices *aigPoIndicesArg, 
					struct antecedentConsequentVectorsStruct *anteConseVectors, int *startMonotonePropPo)
{
	Aig_Man_t *pNewAig;
	int iElem, i, nRegCount;
	int piCopied = 0, liCopied = 0, liCreated = 0, loCopied = 0, loCreated = 0;
	int poCopied = 0, poCreated = 0;
	Aig_Obj_t *pObj, *pObjPo, *pObjDriver, *pObjDriverNew, *pObjPendingDriverNew, *pObjPendingAndNextPending;
	Aig_Obj_t *pPendingFlop, *pObjConseCandFlop, *pObjSafetyInvariantPoDriver;
	//Vec_Ptr_t *vHintMonotoneLocalDriverNew;
	Vec_Ptr_t *vConseCandFlopOutput;
	//Vec_Ptr_t *vHintMonotoneLocalProp;

	Aig_Obj_t *pObjAnteDisjunction, *pObjConsecDriver, *pObjConsecDriverNew, *pObjCandMonotone, *pObjPrevCandMonotone, *pObjMonotonePropDriver;
	Vec_Ptr_t *vCandMonotoneProp;
	Vec_Ptr_t *vCandMonotoneFlopInput;

	int pendingSignalIndexLocal = aigPoIndicesArg->attrPendingSignalIndex;

	Vec_Int_t *vAntecedentsLocal = anteConseVectors->attrAntecedents;
	Vec_Int_t *vConsequentCandidatesLocal = anteConseVectors->attrConsequentCandidates;

	if( vConsequentCandidatesLocal == NULL )
		return NULL; //no candidates for consequent is provided, hence no need to generate a new AIG

	
	//****************************************************************
	// Step1: create the new manager
	// Note: The new manager is created with "2 * Aig_ManObjNumMax(p)"
	// nodes, but this selection is arbitrary - need to be justified
	//****************************************************************
	pNewAig = Aig_ManStart( Aig_ManObjNumMax(pAig) );
	pNewAig->pName = (char *)malloc( strlen( pAig->pName ) + strlen("_monotone") + 2 );
	sprintf(pNewAig->pName, "%s_%s", pAig->pName, "monotone");
    	pNewAig->pSpec = NULL;

	//****************************************************************
	// Step 2: map constant nodes
	//****************************************************************
    	pObj = Aig_ManConst1( pAig );
    	pObj->pData = Aig_ManConst1( pNewAig );

	//****************************************************************
    	// Step 3: create true PIs
	//****************************************************************
    	Saig_ManForEachPi( pAig, pObj, i )
	{
		piCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
	}

	//****************************************************************
	// Step 5: create register outputs
	//****************************************************************
    	Saig_ManForEachLo( pAig, pObj, i )
    	{
		loCopied++;
		pObj->pData = Aig_ObjCreateCi(pNewAig);
    	}

	//****************************************************************
	// Step 6: create "D" register output for PENDING flop 
	//****************************************************************
	loCreated++;
	pPendingFlop = Aig_ObjCreateCi( pNewAig );

	//****************************************************************
	// Step 6.a: create "D" register output for HINT_MONOTONE flop 
	//****************************************************************
	vConseCandFlopOutput = Vec_PtrAlloc(Vec_IntSize(vConsequentCandidatesLocal));
	Vec_IntForEachEntry( vConsequentCandidatesLocal, iElem, i )
	{
		loCreated++;
		pObjConseCandFlop = Aig_ObjCreateCi( pNewAig );
		Vec_PtrPush( vConseCandFlopOutput, pObjConseCandFlop );
	}

	nRegCount = loCreated + loCopied;

	//********************************************************************
	// Step 7: create internal nodes
	//********************************************************************
    	Aig_ManForEachNode( pAig, pObj, i )
	{
		pObj->pData = Aig_And( pNewAig, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
	}
	
	//********************************************************************
	// Step 8: mapping appropriate new flop drivers 
	//********************************************************************

	if( aigPoIndicesArg->attrSafetyInvarIndex != -1 )
	{
		pObjPo = Aig_ManCo( pAig, aigPoIndicesArg->attrSafetyInvarIndex );
		pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
		pObjDriverNew = !Aig_IsComplement(pObjDriver)? 
				(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
				Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));
		pObjSafetyInvariantPoDriver = pObjDriverNew;
	}
	else
		pObjSafetyInvariantPoDriver = Aig_ManConst1(pNewAig);

	pObjPo = Aig_ManCo( pAig, pendingSignalIndexLocal );
	pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
	pObjPendingDriverNew = !Aig_IsComplement(pObjDriver)? 
				(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
				Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));

	pObjPendingAndNextPending = Aig_And( pNewAig, pObjPendingDriverNew, pPendingFlop );

	pObjAnteDisjunction = Aig_Not(Aig_ManConst1( pNewAig ));
	if( vAntecedentsLocal )
	{
		Vec_IntForEachEntry( vAntecedentsLocal, iElem, i )
		{
			pObjPo = Aig_ManCo( pAig, iElem );
			pObjDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
			pObjDriverNew = !Aig_IsComplement(pObjDriver)? 
					(Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData) : 
					Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjDriver)->pData));

			pObjAnteDisjunction = Aig_Or( pNewAig, pObjDriverNew, pObjAnteDisjunction );
		}
	}

	vCandMonotoneProp = Vec_PtrAlloc( Vec_IntSize(vConsequentCandidatesLocal) );
	vCandMonotoneFlopInput = Vec_PtrAlloc( Vec_IntSize(vConsequentCandidatesLocal) );
	Vec_IntForEachEntry( vConsequentCandidatesLocal, iElem, i )
	{
		pObjPo = Aig_ManCo( pAig, iElem );
		pObjConsecDriver = Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin0(pObjPo), Aig_ObjFaninC0(pObjPo));
		pObjConsecDriverNew = !Aig_IsComplement(pObjConsecDriver)? 
					(Aig_Obj_t *)(Aig_Regular(pObjConsecDriver)->pData) : 
					Aig_Not((Aig_Obj_t *)(Aig_Regular(pObjConsecDriver)->pData));

		pObjCandMonotone = Aig_Or( pNewAig, pObjConsecDriverNew, pObjAnteDisjunction );
		pObjPrevCandMonotone = (Aig_Obj_t *)(Vec_PtrEntry( vConseCandFlopOutput, i ));
		pObjMonotonePropDriver = Aig_Or( pNewAig, Aig_Not( Aig_And( pNewAig, pObjPendingAndNextPending, pObjPrevCandMonotone ) ), 
						pObjCandMonotone );

		//Conjunting safety invar
		pObjMonotonePropDriver = Aig_And( pNewAig, pObjMonotonePropDriver, pObjSafetyInvariantPoDriver );
						
		Vec_PtrPush( vCandMonotoneFlopInput, pObjCandMonotone );
		Vec_PtrPush( vCandMonotoneProp, pObjMonotonePropDriver );
	}

	//********************************************************************
	// Step 9: create primary outputs 
	//********************************************************************
	Saig_ManForEachPo( pAig, pObj, i )
	{
		poCopied++;
		pObj->pData = Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) ); 
	}

	*startMonotonePropPo = i;
	Vec_PtrForEachEntry( Aig_Obj_t *, vCandMonotoneProp, pObj, i )
	{
		poCreated++;
		pObjPo = Aig_ObjCreateCo( pNewAig, pObj ); 
	}

	//********************************************************************
	// Step 9: create latch inputs 
	//********************************************************************

	Saig_ManForEachLi( pAig, pObj, i )
	{
		liCopied++;
		Aig_ObjCreateCo( pNewAig, Aig_ObjChild0Copy(pObj) );
	}
	
	//********************************************************************
	// Step 9.a: create latch input for PENDING_FLOP
	//********************************************************************

	liCreated++;
	Aig_ObjCreateCo( pNewAig, pObjPendingDriverNew );

	//********************************************************************
	// Step 9.b: create latch input for MONOTONE_FLOP
	//********************************************************************

	Vec_PtrForEachEntry( Aig_Obj_t *, vCandMonotoneFlopInput, pObj, i )
	{
		liCreated++;
		Aig_ObjCreateCo( pNewAig, pObj );
	}

	Aig_ManSetRegNum( pNewAig, nRegCount );
	Aig_ManCleanup( pNewAig );
	
	assert( Aig_ManCheck( pNewAig ) );
	assert( loCopied + loCreated == liCopied + liCreated );

	Vec_PtrFree(vConseCandFlopOutput);
	Vec_PtrFree(vCandMonotoneProp);
	Vec_PtrFree(vCandMonotoneFlopInput);
	return pNewAig;
}